

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBufferPool.cpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanCommandBufferPool::~VulkanCommandBufferPool(VulkanCommandBufferPool *this)

{
  _Elt_pointer ppVVar1;
  char (*in_RCX) [236];
  _Elt_pointer ppVVar2;
  _Elt_pointer ppVVar3;
  _Map_pointer pppVVar4;
  string msg;
  
  if ((this->m_BuffCounter).super___atomic_base<int>._M_i != 0) {
    Diligent::FormatString<std::atomic<int>,char[236]>
              (&msg,(Diligent *)&this->m_BuffCounter,
               (atomic<int> *)
               " command buffer(s) have not been returned to the pool. If there are outstanding references to these buffers in release queues, VulkanCommandBufferPool::RecycleCommandBuffer() will crash when attempting to return the buffer to the pool."
               ,in_RCX);
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"~VulkanCommandBufferPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBufferPool.cpp"
               ,0x3c);
    std::__cxx11::string::~string((string *)&msg);
  }
  ppVVar3 = (this->m_CmdBuffers).
            super__Deque_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppVVar2 = (this->m_CmdBuffers).
            super__Deque_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  pppVVar4 = (this->m_CmdBuffers).
             super__Deque_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  ppVVar1 = (this->m_CmdBuffers).
            super__Deque_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  while (ppVVar3 != ppVVar1) {
    VulkanLogicalDevice::FreeCommandBuffer
              ((this->m_LogicalDevice).
               super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,(this->m_CmdPool).m_VkObject,*ppVVar3);
    ppVVar3 = ppVVar3 + 1;
    if (ppVVar3 == ppVVar2) {
      ppVVar3 = pppVVar4[1];
      pppVVar4 = pppVVar4 + 1;
      ppVVar2 = ppVVar3 + 0x40;
    }
  }
  VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::Release
            (&this->m_CmdPool);
  std::_Deque_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::~_Deque_base
            (&(this->m_CmdBuffers).
              super__Deque_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>);
  VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::
  ~VulkanObjectWrapper(&this->m_CmdPool);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_LogicalDevice).
              super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

VulkanCommandBufferPool::~VulkanCommandBufferPool()
{
    DEV_CHECK_ERR(m_BuffCounter == 0, m_BuffCounter,
                  " command buffer(s) have not been returned to the pool. If there are outstanding references to these "
                  "buffers in release queues, VulkanCommandBufferPool::RecycleCommandBuffer() will crash when attempting to "
                  "return the buffer to the pool.");

    for (auto CmdBuff : m_CmdBuffers)
        m_LogicalDevice->FreeCommandBuffer(m_CmdPool, CmdBuff);
    m_CmdPool.Release();
}